

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveArea.cpp
# Opt level: O1

bool __thiscall CDirectiveArea::Validate(CDirectiveArea *this,ValidateState *state)

{
  int64_t *dest;
  int64_t *dest_00;
  long position;
  long space;
  long lVar1;
  CAssemblerCommand *pCVar2;
  long lVar3;
  long fileID;
  bool bVar4;
  int iVar5;
  Architecture *pAVar6;
  int64_t iVar7;
  long lVar8;
  byte bVar9;
  char *text;
  ValidateState contentValidation;
  long local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  position = this->position;
  space = this->areaSize;
  lVar1 = this->contentSize;
  dest = &this->position;
  if ((this->positionExpression).expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    iVar7 = FileManager::getVirtualAddress(g_fileManager);
    *dest = iVar7;
  }
  else {
    bVar4 = Expression::evaluateInteger<long>(&this->positionExpression,dest);
    if (!bVar4) {
      text = "Invalid position expression";
      goto LAB_00184ad4;
    }
    pAVar6 = Architecture::current();
    (*pAVar6->_vptr_Architecture[3])(pAVar6);
    FileManager::seekVirtual(g_fileManager,*dest);
  }
  dest_00 = &this->areaSize;
  bVar4 = Expression::evaluateInteger<long>(&this->sizeExpression,dest_00);
  if (!bVar4) {
    text = "Invalid size expression";
LAB_00184ad4:
    Logger::queueError<>(Error,text);
    return false;
  }
  if (*dest_00 < 0) {
    text = "Negative area size";
    goto LAB_00184ad4;
  }
  if (((this->fillExpression).expression.
       super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) &&
     (bVar4 = Expression::evaluateInteger<signed_char>(&this->fillExpression,&this->fillValue),
     !bVar4)) {
    text = "Invalid fill expression";
    goto LAB_00184ad4;
  }
  pCVar2 = (this->content)._M_t.
           super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
           super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  if (pCVar2 == (CAssemblerCommand *)0x0) {
    bVar9 = 0;
  }
  else {
    local_38 = *(undefined8 *)&state->passes;
    local_48 = CONCAT71((int7)((ulong)*(undefined8 *)state >> 8),1);
    pcStack_40 = "area";
    CAssemblerCommand::applyFileInfo(pCVar2);
    pCVar2 = (this->content)._M_t.
             super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
             super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
             super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
    iVar5 = (*pCVar2->_vptr_CAssemblerCommand[2])(pCVar2,&local_48);
    bVar9 = (byte)iVar5;
  }
  iVar7 = FileManager::getVirtualAddress(g_fileManager);
  this->contentSize = iVar7 - this->position;
  CAssemblerCommand::applyFileInfo(&this->super_CAssemblerCommand);
  lVar8 = this->contentSize - this->areaSize;
  if (lVar8 != 0 && this->areaSize <= this->contentSize) {
    local_48 = lVar8;
    Logger::queueError<long,long>(Error,"Area at %08x overflowed by %d bytes",dest,&local_48);
  }
  if (((this->fillExpression).expression.
       super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) || ((this->super_CAssemblerCommand).field_0x14 == '\x01')) {
    FileManager::advanceMemory(g_fileManager,this->areaSize - this->contentSize);
  }
  lVar8 = this->areaSize;
  lVar3 = this->contentSize;
  fileID = this->fileID;
  iVar7 = FileManager::getOpenFileID(g_fileManager);
  this->fileID = iVar7;
  if ((fileID == iVar7) && (position == this->position)) {
    if (*dest_00 != 0 || space == 0) goto LAB_00184bbd;
  }
  else if (space == 0) goto LAB_00184bbd;
  Allocations::forgetArea(fileID,position,space);
LAB_00184bbd:
  bVar9 = bVar9 | (lVar1 != lVar3 || lVar8 != space);
  if (*dest_00 == 0) {
    return (bool)bVar9;
  }
  Allocations::setArea
            (this->fileID,this->position,*dest_00,this->contentSize,
             (this->fillExpression).expression.
             super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0,(bool)(this->super_CAssemblerCommand).field_0x14);
  return (bool)bVar9;
}

Assistant:

bool CDirectiveArea::Validate(const ValidateState &state)
{
	int64_t oldAreaSize = areaSize;
	int64_t oldContentSize = contentSize;
	int64_t oldPosition = position;

	if (positionExpression.isLoaded())
	{
		if (!positionExpression.evaluateInteger(position))
		{
			Logger::queueError(Logger::Error, "Invalid position expression");
			return false;
		}
		Architecture::current().NextSection();
		g_fileManager->seekVirtual(position);
	}
	else
		position = g_fileManager->getVirtualAddress();

	if (!sizeExpression.evaluateInteger(areaSize))
	{
		Logger::queueError(Logger::Error, "Invalid size expression");
		return false;
	}

	if (areaSize < 0)
	{
		Logger::queueError(Logger::Error, "Negative area size");
		return false;
	}

	if (fillExpression.isLoaded())
	{
		if (!fillExpression.evaluateInteger(fillValue))
		{
			Logger::queueError(Logger::Error, "Invalid fill expression");
			return false;
		}
	}

	bool result = false;
	if (content)
	{
		ValidateState contentValidation = state;
		contentValidation.noFileChange = true;
		contentValidation.noFileChangeDirective = "area";
		content->applyFileInfo();
		result = content->Validate(contentValidation);
	}
	contentSize = g_fileManager->getVirtualAddress()-position;

	// restore info of this command
	applyFileInfo();

	if (areaSize < contentSize)
	{
		Logger::queueError(Logger::Error, "Area at %08x overflowed by %d bytes", position, contentSize - areaSize);
	}

	if (fillExpression.isLoaded() || shared)
		g_fileManager->advanceMemory(areaSize-contentSize);

	if (areaSize != oldAreaSize || contentSize != oldContentSize)
		result = true;

	int64_t oldFileID = fileID;
	fileID = g_fileManager->getOpenFileID();

	if ((oldFileID != fileID || oldPosition != position || areaSize == 0) && oldAreaSize != 0)
		Allocations::forgetArea(oldFileID, oldPosition, oldAreaSize);
	if (areaSize != 0)
		Allocations::setArea(fileID, position, areaSize, contentSize, fillExpression.isLoaded(), shared);

	return result;
}